

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithOutInvariant_ThatACallToAFailingPostConditionFireTheSetException_Test::
TestBody(ContractTestOnClassWithOutInvariant_ThatACallToAFailingPostConditionFireTheSetException_Test
         *this)

{
  bool bVar1;
  char *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined1 in_stack_ffffffffffffff2f;
  AssertionResult *in_stack_ffffffffffffff30;
  AssertionResult *this_00;
  char *in_stack_ffffffffffffff40;
  AssertionResult *this_01;
  int in_stack_ffffffffffffff4c;
  int line;
  string local_a8 [4];
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff7c;
  TestClassWithOutInvariant *in_stack_ffffffffffffff80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  AssertionResult *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  AssertionResult local_38 [3];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_ffffffffffffff4c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if (bVar1) {
      anon_unknown.dwarf_114b::TestClassWithOutInvariant::doubleX
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
  }
  else {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RDI,in_stack_ffffffffffffff4c,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0x142534);
  }
  this_01 = local_38;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13((char)((uint)in_stack_ffffffffffffff4c >> 0x18),
                  CONCAT12(bVar1,(short)in_stack_ffffffffffffff4c));
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RDI,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    testing::Message::~Message((Message *)0x142673);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1426e8);
  this_00 = (AssertionResult *)&stack0xffffffffffffff88;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_ffffffffffffff2f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RDI,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_a8);
    testing::Message::~Message((Message *)0x1427d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x142844);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithOutInvariant, ThatACallToAFailingPostConditionFireTheSetException)
{
  EXPECT_NO_THROW(sut.doubleX(2));
  EXPECT_TRUE(postConditionHasFailedFlag);

  EXPECT_TRUE(sut.postConditionWasCalled);
}